

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O0

void __thiscall MessageCracker::process(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  Header *this_00;
  _Self local_428;
  _Self local_420;
  undefined1 local_418 [8];
  pair<FIX::ClOrdID,_FIX::SessionID> pair;
  ClOrdID clOrdID;
  BOOLEAN local_1d9;
  undefined1 local_1d8 [8];
  PossResend possResend;
  Message echo;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  FIX::Message::Message
            ((Message *)&possResend.super_BoolField.super_FieldBase.m_metrics.m_checksum,message);
  local_1d9 = false;
  FIX::PossResend::PossResend((PossResend *)local_1d8,&local_1d9);
  this_00 = FIX::Message::getHeader(message);
  FIX::FieldMap::getFieldIfSet((FieldMap *)this_00,(FieldBase *)local_1d8);
  FIX::ClOrdID::ClOrdID((ClOrdID *)((long)&pair.second.m_frozenString.field_2 + 8));
  FIX::FieldMap::getField
            ((FieldMap *)message,(FieldBase *)((long)&pair.second.m_frozenString.field_2 + 8));
  std::make_pair<FIX::ClOrdID&,FIX::SessionID_const&>
            ((pair<FIX::ClOrdID,_FIX::SessionID> *)local_418,
             (ClOrdID *)((long)&pair.second.m_frozenString.field_2 + 8),sessionID);
  bVar1 = FIX::BoolField::operator_cast_to_bool((BoolField *)local_1d8);
  if (bVar1) {
    local_420._M_node =
         (_Base_ptr)
         std::
         set<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
         ::find(&this->m_orderIDs,(key_type *)local_418);
    local_428._M_node =
         (_Base_ptr)
         std::
         set<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
         ::end(&this->m_orderIDs);
    bVar1 = std::operator!=(&local_420,&local_428);
    if (bVar1) goto LAB_001693a9;
  }
  std::
  set<std::pair<FIX::ClOrdID,_FIX::SessionID>,_std::less<std::pair<FIX::ClOrdID,_FIX::SessionID>_>,_std::allocator<std::pair<FIX::ClOrdID,_FIX::SessionID>_>_>
  ::insert(&this->m_orderIDs,(value_type *)local_418);
  FIX::Session::sendToTarget
            ((Message *)&possResend.super_BoolField.super_FieldBase.m_metrics.m_checksum,sessionID);
LAB_001693a9:
  std::pair<FIX::ClOrdID,_FIX::SessionID>::~pair((pair<FIX::ClOrdID,_FIX::SessionID> *)local_418);
  FIX::ClOrdID::~ClOrdID((ClOrdID *)((long)&pair.second.m_frozenString.field_2 + 8));
  FIX::PossResend::~PossResend((PossResend *)local_1d8);
  FIX::Message::~Message
            ((Message *)&possResend.super_BoolField.super_FieldBase.m_metrics.m_checksum);
  return;
}

Assistant:

void process( const FIX::Message& message, const FIX::SessionID& sessionID )
  {
    FIX::Message echo = message;
    FIX::PossResend possResend( false );
    message.getHeader().getFieldIfSet( possResend );

    FIX::ClOrdID clOrdID;
    message.getField( clOrdID );

    std::pair < FIX::ClOrdID, FIX::SessionID > pair =
      std::make_pair( clOrdID, sessionID );

    if ( possResend == true )
    {
      if ( m_orderIDs.find( pair ) != m_orderIDs.end() )
        return ;
    }
    m_orderIDs.insert( pair );
    FIX::Session::sendToTarget( echo, sessionID );
  }